

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senary_executor.hpp
# Opt level: O1

void duckdb::SenaryExecutor::
     Execute<long,long,long,long,long,double,duckdb::timestamp_t,duckdb::timestamp_t(*)(long,long,long,long,long,double)>
               (DataChunk *input,Vector *result,
               _func_timestamp_t_long_long_long_long_long_double *fun)

{
  ulong *puVar1;
  pointer pVVar2;
  pointer pVVar3;
  idx_t count;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  int64_t *piVar15;
  unsigned_long *puVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar17;
  element_type *peVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  value_type_conflict1 *__val;
  reference pvVar20;
  reference pvVar21;
  reference pvVar22;
  timestamp_t tVar23;
  TemplatedValidityData<unsigned_long> *pTVar24;
  pointer pVVar25;
  bool bVar26;
  size_t c_1;
  size_type sVar27;
  vector<duckdb::Vector,_true> *__range2;
  size_t c;
  size_type __n;
  idx_t iVar28;
  ulong uVar29;
  idx_t iVar30;
  ulong uVar31;
  bool bVar32;
  vector<unsigned_long,_true> idx;
  vector<duckdb::UnifiedVectorFormat,_true> vdata;
  vector<unsigned_long,_true> local_c8;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_a8;
  data_ptr_t local_90;
  data_ptr_t local_88;
  data_ptr_t local_80;
  data_ptr_t local_78;
  data_ptr_t local_70;
  data_ptr_t local_68;
  data_ptr_t local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  pVVar2 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar2 == pVVar3) {
    bVar32 = true;
    bVar26 = false;
  }
  else {
    bVar32 = true;
    bVar26 = false;
    do {
      pVVar25 = pVVar2 + 1;
      if (pVVar2->vector_type == CONSTANT_VECTOR) {
        puVar16 = (pVVar2->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar16 != (unsigned_long *)0x0) && ((*puVar16 & 1) == 0)) {
          bVar26 = true;
        }
      }
      else {
        bVar32 = false;
      }
    } while ((pVVar2->vector_type == CONSTANT_VECTOR) && (pVVar2 = pVVar25, pVVar25 != pVVar3));
  }
  if (bVar32) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    if (bVar26) {
      ConstantVector::SetNull(result,true);
      return;
    }
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    plVar10 = (long *)pvVar22->data;
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    plVar11 = (long *)pvVar22->data;
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,2);
    plVar12 = (long *)pvVar22->data;
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,3);
    plVar13 = (long *)pvVar22->data;
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,4);
    plVar14 = (long *)pvVar22->data;
    pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,5);
    piVar15 = (int64_t *)result->data;
    tVar23 = (*fun)(*plVar10,*plVar11,*plVar12,*plVar13,*plVar14,*(double *)pvVar22->data);
    *piVar15 = tVar23.value;
  }
  else {
    count = input->count;
    __n = 0;
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_60 = result->data;
    FlatVector::VerifyFlatVector(result);
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
              (&local_a8,6,(allocator_type *)&local_c8);
    bVar32 = true;
    do {
      pvVar22 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
      pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                          ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,__n);
      Vector::ToUnifiedFormat(pvVar22,count,pvVar20);
      if (bVar32) {
        pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,__n);
        bVar32 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0;
      }
      else {
        bVar32 = false;
      }
      __n = __n + 1;
    } while (__n != 6);
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,0);
    local_68 = pvVar20->data;
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,1);
    local_70 = pvVar20->data;
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,2);
    local_78 = pvVar20->data;
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,3);
    local_80 = pvVar20->data;
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,4);
    local_88 = pvVar20->data;
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,5);
    local_90 = pvVar20->data;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start + 6;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[4] = 0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[5] = 0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[2] = 0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[3] = 0;
    *local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (bVar32) {
      if (count != 0) {
        iVar28 = 0;
        do {
          sVar27 = 0;
          do {
            pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,sVar27);
            psVar4 = pvVar20->sel->sel_vector;
            iVar30 = iVar28;
            if (psVar4 != (sel_t *)0x0) {
              iVar30 = (idx_t)psVar4[iVar28];
            }
            pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,sVar27);
            *pvVar21 = iVar30;
            sVar27 = sVar27 + 1;
          } while (sVar27 != 6);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,0);
          lVar5 = *(long *)(local_68 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,1);
          lVar6 = *(long *)(local_70 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,2);
          lVar7 = *(long *)(local_78 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,3);
          lVar8 = *(long *)(local_80 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,4);
          lVar9 = *(long *)(local_88 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,5);
          tVar23 = (*fun)(lVar5,lVar6,lVar7,lVar8,lVar9,*(double *)(local_90 + *pvVar21 * 8));
          *(int64_t *)(local_60 + iVar28 * 8) = tVar23.value;
          iVar28 = iVar28 + 1;
        } while (iVar28 != count);
      }
    }
    else if (count != 0) {
      local_40 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar29 = 0;
      do {
        sVar27 = 0;
        do {
          pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                              ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,sVar27);
          psVar4 = pvVar20->sel->sel_vector;
          uVar31 = uVar29;
          if (psVar4 != (sel_t *)0x0) {
            uVar31 = (ulong)psVar4[uVar29];
          }
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,sVar27);
          *pvVar21 = uVar31;
          pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                              ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a8,sVar27);
          pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,sVar27);
          puVar16 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar16 != (unsigned_long *)0x0) &&
             ((puVar16[*pvVar21 >> 6] >> (*pvVar21 & 0x3f) & 1) == 0)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_38);
              p_Var19 = p_Stack_50;
              peVar18 = local_58;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar18;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var19;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar24 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_40);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar24->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar17 = (byte)uVar29 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar29 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
            goto LAB_01a8d9a1;
          }
          sVar27 = sVar27 + 1;
        } while (sVar27 != 6);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,0);
        lVar5 = *(long *)(local_68 + *pvVar21 * 8);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,1);
        lVar6 = *(long *)(local_70 + *pvVar21 * 8);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,2);
        lVar7 = *(long *)(local_78 + *pvVar21 * 8);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,3);
        lVar8 = *(long *)(local_80 + *pvVar21 * 8);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,4);
        lVar9 = *(long *)(local_88 + *pvVar21 * 8);
        pvVar21 = vector<unsigned_long,_true>::operator[](&local_c8,5);
        tVar23 = (*fun)(lVar5,lVar6,lVar7,lVar8,lVar9,*(double *)(local_90 + *pvVar21 * 8));
        *(int64_t *)(local_60 + uVar29 * 8) = tVar23.value;
LAB_01a8d9a1:
        uVar29 = uVar29 + 1;
      } while (uVar29 != count);
    }
    if (local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_a8);
  }
  return;
}

Assistant:

static void Execute(DataChunk &input, Vector &result, FUN fun) {
		D_ASSERT(input.ColumnCount() >= NCOLS);
		const auto count = input.size();

		bool all_constant = true;
		bool any_null = false;
		for (const auto &v : input.data) {
			if (v.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				if (ConstantVector::IsNull(v)) {
					any_null = true;
				}
			} else {
				all_constant = false;
				break;
			}
		}

		if (all_constant) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (any_null) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<TA>(input.data[0]);
				auto bdata = ConstantVector::GetData<TB>(input.data[1]);
				auto cdata = ConstantVector::GetData<TC>(input.data[2]);
				auto ddata = ConstantVector::GetData<TD>(input.data[3]);
				auto edata = ConstantVector::GetData<TE>(input.data[4]);
				auto fdata = ConstantVector::GetData<TF>(input.data[5]);
				auto result_data = ConstantVector::GetData<TR>(result);
				result_data[0] = fun(*adata, *bdata, *cdata, *ddata, *edata, *fdata);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<TR>(result);
			auto &result_validity = FlatVector::Validity(result);

			bool all_valid = true;
			vector<UnifiedVectorFormat> vdata(NCOLS);
			for (size_t c = 0; c < NCOLS; ++c) {
				input.data[c].ToUnifiedFormat(count, vdata[c]);
				all_valid = all_valid && vdata[c].validity.AllValid();
			}

			auto adata = (const TA *)(vdata[0].data);
			auto bdata = (const TB *)(vdata[1].data);
			auto cdata = (const TC *)(vdata[2].data);
			auto ddata = (const TD *)(vdata[3].data);
			auto edata = (const TE *)(vdata[4].data);
			auto fdata = (const TF *)(vdata[5].data);

			vector<idx_t> idx(NCOLS);
			if (all_valid) {
				for (idx_t r = 0; r < count; ++r) {
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
					}
					result_data[r] =
					    fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]], fdata[idx[5]]);
				}
			} else {
				for (idx_t r = 0; r < count; ++r) {
					all_valid = true;
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
						if (!vdata[c].validity.RowIsValid(idx[c])) {
							result_validity.SetInvalid(r);
							all_valid = false;
							break;
						}
					}
					if (all_valid) {
						result_data[r] = fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]],
						                     fdata[idx[5]]);
					}
				}
			}
		}
	}